

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O0

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::_removeThisFromSuccessorsPredecessors
          (SubgraphNode<dg::pta::PSNode> *this,PSNode *succ)

{
  bool bVar1;
  reference ppPVar2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_RDI;
  PSNode *p;
  iterator __end0;
  iterator __begin0;
  NodesVec *__range2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> tmp;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffff98;
  PSNode *in_stack_ffffffffffffffa0;
  SubgraphNode<dg::pta::PSNode> *in_stack_ffffffffffffffa8;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  in_stack_ffffffffffffffc8;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffffd0;
  
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::vector
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x1aac42);
  predecessorsNum((SubgraphNode<dg::pta::PSNode> *)0x1aac50);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
            (in_stack_ffffffffffffff98);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end(in_stack_ffffffffffffff98)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                           *)&stack0xffffffffffffffc8);
    in_stack_ffffffffffffffa0 = *ppPVar2;
    in_stack_ffffffffffffffa8 = (SubgraphNode<dg::pta::PSNode> *)0x0;
    if (in_stack_ffffffffffffffa0 != (PSNode *)0x0) {
      in_stack_ffffffffffffffa8 = &in_stack_ffffffffffffffa0->super_SubgraphNode<dg::pta::PSNode>;
    }
    if (in_stack_ffffffffffffffa8 != (SubgraphNode<dg::pta::PSNode> *)in_RDI) {
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                (in_RDI,(value_type *)in_stack_ffffffffffffffa8);
    }
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::swap
            (in_RDI,(vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                    in_stack_ffffffffffffffa8);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~vector(in_RDI);
  return;
}

Assistant:

void _removeThisFromSuccessorsPredecessors(NodeT *succ) {
        std::vector<NodeT *> tmp;
        tmp.reserve(succ->predecessorsNum());
        for (NodeT *p : succ->_predecessors) {
            if (p != this)
                tmp.push_back(p);
        }

        succ->_predecessors.swap(tmp);
    }